

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O3

void QGraphicsTransform::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  QGraphicsItem *this;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  this = *(QGraphicsItem **)(*(long *)(_o + 8) + 0x78);
  if (this != (QGraphicsItem *)0x0) {
    QGraphicsItem::prepareGeometryChange(this);
    puVar1 = &((this->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
  }
  return;
}

Assistant:

void QGraphicsTransform::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsTransform *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->update(); break;
        default: ;
        }
    }
    (void)_a;
}